

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

bool __thiscall
mpt::unique_array<mpt::metatype_*>::reserve(unique_array<mpt::metatype_*> *this,long len)

{
  content<mpt::metatype_*> *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  content<mpt::metatype_*> *pcVar3;
  content<mpt::metatype_*> *pcVar4;
  bool bVar5;
  
  pcVar4 = (this->_ref)._ref;
  (this->_ref)._ref = (content<mpt::metatype_*> *)0x0;
  if (pcVar4 == (content<mpt::metatype_*> *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = -1 < len;
    if (bVar5) {
      iVar2 = (*(pcVar4->super_buffer)._vptr_buffer[3])(pcVar4,len << 3);
      pcVar1 = (this->_ref)._ref;
      pcVar3 = (content<mpt::metatype_*> *)CONCAT44(extraout_var,iVar2);
      if ((content<mpt::metatype_*> *)CONCAT44(extraout_var,iVar2) ==
          (content<mpt::metatype_*> *)0x0) {
        pcVar3 = pcVar4;
      }
      pcVar4 = pcVar3;
      if (pcVar1 != (content<mpt::metatype_*> *)0x0) {
        (*(pcVar1->super_buffer)._vptr_buffer[1])();
      }
    }
    (this->_ref)._ref = pcVar4;
  }
  return bVar5;
}

Assistant:

extern void copy(long pts, const SRC *src, DST *dest)
{
	for (long i = 0; i < pts; i++) {
		dest[i] = src[i];
	}
}